

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# videomenu.cpp
# Opt level: O0

void M_InitVideoModesMenu(void)

{
  IVideo *pIVar1;
  uint uVar2;
  uint local_1c;
  ulong uStack_18;
  uint i;
  size_t currval;
  int dummy2;
  int dummy1;
  
  uStack_18 = 0;
  M_RefreshModesList();
  FBaseCVar::Callback(&vid_tft.super_FBaseCVar);
  for (local_1c = 1; pIVar1 = Video, local_1c < 0x21 && uStack_18 < 0x20; local_1c = local_1c + 1) {
    uVar2 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x21])();
    (*pIVar1->_vptr_IVideo[5])(pIVar1,(ulong)local_1c,(ulong)(uVar2 & 1));
    uVar2 = (*Video->_vptr_IVideo[6])(Video,(long)&currval + 4,&currval,0);
    if ((uVar2 & 1) != 0) {
      BitTranslate[uStack_18] = (BYTE)local_1c;
      uStack_18 = uStack_18 + 1;
    }
  }
  return;
}

Assistant:

void M_InitVideoModesMenu ()
{
	int dummy1, dummy2;
	size_t currval = 0;

	M_RefreshModesList();
	vid_tft.Callback();

	for (unsigned int i = 1; i <= 32 && currval < countof(BitTranslate); i++)
	{
		Video->StartModeIterator (i, screen->IsFullscreen());
		if (Video->NextMode (&dummy1, &dummy2, NULL))
		{
			BitTranslate[currval++] = i;
		}
	}

	/* It doesn't look like this can be anything but DISPLAY_Both, regardless of any other settings.
	switch (Video->GetDisplayType ())
	{
	case DISPLAY_FullscreenOnly:
	case DISPLAY_WindowOnly:
		// todo: gray out fullscreen option
	default:
		break;
	}
	*/
}